

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O0

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createStore(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  bool bVar1;
  PSNode *this_00;
  PSNode *args;
  PSNodesSeq *pPVar2;
  unordered_map<const_llvm::Value_*,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq,_std::hash<const_llvm::Value_*>,_std::equal_to<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>_>
  *in_RDI;
  PSNode *node;
  PSNode *op2;
  iterator it;
  PSNode *op1;
  Value *valOp;
  uint i;
  Value *in_stack_ffffffffffffffc0;
  LLVMPointerGraphBuilder *in_stack_ffffffffffffffc8;
  _Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
  in_stack_ffffffffffffffd0;
  _Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
  in_stack_ffffffffffffffd8;
  
  llvm::User::getOperand((User *)in_stack_ffffffffffffffc0,(uint)((ulong)in_RDI >> 0x20));
  bVar1 = llvm::isa<llvm::AtomicRMWInst,llvm::Value_const*>((Value **)0x1b6f12);
  if (bVar1) {
    in_stack_ffffffffffffffd8._M_cur =
         (__node_type *)
         std::
         unordered_map<const_llvm::Value_*,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq,_std::hash<const_llvm::Value_*>,_std::equal_to<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>_>
         ::find(in_RDI,(key_type *)0x1b6f2d);
    in_stack_ffffffffffffffd0._M_cur =
         (__node_type *)
         std::
         unordered_map<const_llvm::Value_*,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq,_std::hash<const_llvm::Value_*>,_std::equal_to<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>_>
         ::end(in_RDI);
    i = (uint)((ulong)in_RDI >> 0x20);
    bVar1 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
                        *)&stack0xffffffffffffffd8,
                       (_Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
                        *)&stack0xffffffffffffffd0);
    this_00 = UNKNOWN_MEMORY;
    if (!bVar1) {
      std::__detail::
      _Node_iterator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false,_false>
      ::operator->((_Node_iterator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false,_false>
                    *)0x1b6f77);
      this_00 = PSNodesSeq::getFirst((PSNodesSeq *)0x1b6f83);
    }
  }
  else {
    this_00 = getOperand(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    i = (uint)((ulong)in_RDI >> 0x20);
  }
  llvm::User::getOperand((User *)in_stack_ffffffffffffffc0,i);
  args = getOperand(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  PointerGraph::create<(dg::pta::PSNodeType)3,dg::pta::PSNode*&,dg::pta::PSNode*&>
            ((PointerGraph *)in_stack_ffffffffffffffd0._M_cur,(PSNode **)args,
             (PSNode **)in_stack_ffffffffffffffc0);
  pPVar2 = addNode((LLVMPointerGraphBuilder *)this_00,(Value *)in_stack_ffffffffffffffd8._M_cur,
                   (PSNode *)in_stack_ffffffffffffffd0._M_cur);
  return pPVar2;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createStore(const llvm::Instruction *Inst) {
    using namespace llvm;
    const Value *valOp = Inst->getOperand(0);

    PSNode *op1;
    if (isa<AtomicRMWInst>(valOp)) {
        // we store the old value of AtomicRMW
        auto it = nodes_map.find(valOp);
        if (it == nodes_map.end()) {
            op1 = UNKNOWN_MEMORY;
        } else {
            op1 = it->second.getFirst();
            assert(op1->getType() == PSNodeType::LOAD &&
                   "Invalid AtomicRMW nodes seq");
        }
    } else {
        op1 = getOperand(valOp);
    }

    PSNode *op2 = getOperand(Inst->getOperand(1));
    PSNode *node = PS.create<PSNodeType::STORE>(op1, op2);

    assert(node);
    return addNode(Inst, node);
}